

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkMemoryBarrier2 * __thiscall
Fossilize::StateRecorder::Impl::copy<VkMemoryBarrier2>
          (Impl *this,VkMemoryBarrier2 *src,size_t count,ScratchAllocator *alloc)

{
  VkMemoryBarrier2 *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkMemoryBarrier2>(alloc,count);
    if (pVVar1 != (VkMemoryBarrier2 *)0x0) {
      pVVar1 = (VkMemoryBarrier2 *)memmove(pVVar1,src,count * 0x30);
      return pVVar1;
    }
  }
  return (VkMemoryBarrier2 *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}